

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink_test.cpp
# Opt level: O3

void __thiscall
dynlink_test_DefaultConstructor_Test::~dynlink_test_DefaultConstructor_Test
          (dynlink_test_DefaultConstructor_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(dynlink_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	dynlink_print_info();

	log_write("metacall", LOG_LEVEL_DEBUG, "Dynamic linked shared object extension: %s", dynlink_extension());

	{
#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
		const char library_name[] = "mock_loaderd";
#else
		const char library_name[] = "mock_loader";
#endif

		char *path = environment_variable_path_create(DYNLINK_TEST_LIBRARY_PATH, NULL, 0, NULL);

		dynlink handle = dynlink_load(path, library_name, DYNLINK_FLAGS_BIND_NOW | DYNLINK_FLAGS_BIND_GLOBAL);

		environment_variable_path_destroy(path);

		EXPECT_NE(handle, (dynlink)NULL);

		log_write("metacall", LOG_LEVEL_DEBUG, "Dynamic linked shared object file: %s", dynlink_get_name_impl(handle));

		if (handle != NULL)
		{
			static dynlink_symbol_addr mock_loader_print_info_addr;

			EXPECT_EQ((int)0, dynlink_symbol(handle, "mock_loader_print_info", &mock_loader_print_info_addr));

			if (mock_loader_print_info_addr != NULL)
			{
				mock_loader_print_func print = mock_loader_print_info_addr;

				log_write("metacall", LOG_LEVEL_DEBUG, "Print function: %p", (void *)print);

				log_write("metacall", LOG_LEVEL_DEBUG, "Symbol pointer: %p", (void *)mock_loader_print_info_addr);

				if (mock_loader_print_info_addr != NULL)
				{
					log_write("metacall", LOG_LEVEL_DEBUG, "Pointer is valid");
				}

				print();
			}

			dynlink_unload(handle);
		}
	}
}